

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_2
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Index index;
  double *pdVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long lVar7;
  SrcEvaluatorType srcEvaluator;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  VectorXd b3;
  MatrixXd L_6x3;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  assign_op<double,_double> local_289;
  DenseStorage<double,__1,__1,_1,_0> local_288;
  Matrix<double,__1,_1,_0,__1,_1> local_278;
  DenseStorage<double,__1,__1,__1,_0> local_268;
  SrcXprType local_250;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_240;
  
  local_268.m_data = (double *)0x0;
  local_268.m_rows = 0;
  local_268.m_cols = 0;
  lVar7 = 6;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_268,0x12,6,3);
  pdVar4 = local_268.m_data;
  do {
    *pdVar4 = *(double *)L_6x10;
    pdVar4[local_268.m_rows] = *(double *)((long)L_6x10 + 0x30);
    pdVar1 = (double *)((long)L_6x10 + 0x60);
    L_6x10 = (Matrix<double,_6,_10,_0,_6,_10> *)((long)L_6x10 + 8);
    pdVar4[local_268.m_rows * 2] = *pdVar1;
    pdVar4 = pdVar4 + 1;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_240,(MatrixType *)&local_268,0x14);
  pvVar5 = malloc(0x70);
  if (pvVar5 == (void *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = srand;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(void **)(((ulong)pvVar5 & 0xffffffffffffffc0) + 0x38) = pvVar5;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)(((ulong)pvVar5 & 0xffffffffffffffc0) + 0x40);
  lVar7 = 0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
  do {
    local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar7]
         = (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  local_250.m_rhs = &local_278;
  local_288 = (DenseStorage<double,__1,__1,_1,_0>)(ZEXT816(0) << 0x20);
  local_250.m_dec =
       &local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_288,
             local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_cols,1);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_288,&local_250,&local_289);
  dVar10 = *local_288.m_data;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar10;
  if (0.0 <= dVar10) {
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar10 = auVar9._0_8_;
    }
    *betas = dVar10;
    dVar10 = 0.0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_288.m_data[2];
    if (local_288.m_data[2] <= 0.0) goto LAB_00177f16;
  }
  else {
    auVar13._0_8_ = -dVar10;
    auVar13._8_8_ = 0x8000000000000000;
    if (-0.0 < dVar10) {
      dVar10 = sqrt(auVar13._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar13,auVar13);
      dVar10 = auVar9._0_8_;
    }
    *betas = dVar10;
    dVar10 = 0.0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_288.m_data[2];
    if (0.0 <= local_288.m_data[2]) goto LAB_00177f16;
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar11,auVar2);
  }
  if (auVar8._0_8_ < 0.0) {
    dVar10 = sqrt(auVar8._0_8_);
  }
  else {
    auVar9 = vsqrtsd_avx(auVar8,auVar8);
    dVar10 = auVar9._0_8_;
  }
LAB_00177f16:
  betas[1] = dVar10;
  if (local_288.m_data[1] < 0.0) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *betas;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar12,auVar3);
    dVar10 = (double)vmovlpd_avx(auVar9);
    *betas = dVar10;
  }
  betas[2] = 0.0;
  betas[3] = 0.0;
  free((void *)local_288.m_data[-1]);
  if (local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_240);
  if (local_268.m_data != (double *)0x0) {
    free((void *)local_268.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_2(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x3(6,3);

  for(int i = 0; i < 6; i++)
  {
    L_6x3(i,0) = L_6x10(i,0);
    L_6x3(i,1) = L_6x10(i,1);
    L_6x3(i,2) = L_6x10(i,2);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x3,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b3 = SVD.solve(Rho_temp);

  if (b3[0] < 0)
  {
    betas[0] = sqrt(-b3[0]);
    betas[1] = (b3[2] < 0) ? sqrt(-b3[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b3[0]);
    betas[1] = (b3[2] > 0) ? sqrt(b3[2]) : 0.0;
  }

  if (b3[1] < 0) betas[0] = -betas[0];

  betas[2] = 0.0;
  betas[3] = 0.0;
}